

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O1

string * __thiscall
t_js_generator::render_includes_abi_cxx11_(string *__return_storage_ptr__,t_js_generator *this)

{
  undefined8 *puVar1;
  t_program *program;
  long *plVar2;
  undefined8 *puVar3;
  _Base_ptr *pp_Var4;
  ulong *puVar5;
  pointer pptVar6;
  t_js_generator *ptVar7;
  ulong uVar8;
  undefined8 uVar9;
  undefined8 *local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  string local_e8;
  ulong *local_c8;
  long local_c0;
  ulong local_b8;
  long lStack_b0;
  t_js_generator *local_a8;
  long local_a0;
  undefined1 local_98 [24];
  _Base_ptr local_80;
  _Base_ptr local_78;
  _Base_ptr p_Stack_70;
  t_program *local_68;
  t_program *local_60;
  _Alloc_hider local_58;
  string local_50;
  
  local_60 = (t_program *)&__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_60;
  ptVar7 = (t_js_generator *)0x378967;
  std::__cxx11::string::_M_construct<char_const*>();
  if (this->gen_node_ == true) {
    local_68 = (this->super_t_oop_generator).super_t_generator.program_;
    pptVar6 = (local_68->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_58._M_p =
         (pointer)(local_68->includes_).
                  super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    if (pptVar6 != (pointer)local_58._M_p) {
      do {
        program = *pptVar6;
        make_valid_nodeJs_identifier(&local_50,ptVar7,&program->name_);
        plVar2 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_50,0,(char *)0x0,
                                    (ulong)(this->js_const_type_)._M_dataplus._M_p);
        local_98._16_8_ = &local_78;
        pp_Var4 = (_Base_ptr *)(plVar2 + 2);
        if ((_Base_ptr *)*plVar2 == pp_Var4) {
          local_78 = *pp_Var4;
          p_Stack_70 = (_Base_ptr)plVar2[3];
        }
        else {
          local_78 = *pp_Var4;
          local_98._16_8_ = (_Base_ptr *)*plVar2;
        }
        local_80 = (_Base_ptr)plVar2[1];
        *plVar2 = (long)pp_Var4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append(local_98 + 0x10);
        puVar5 = (ulong *)(plVar2 + 2);
        if ((ulong *)*plVar2 == puVar5) {
          local_b8 = *puVar5;
          lStack_b0 = plVar2[3];
          local_c8 = &local_b8;
        }
        else {
          local_b8 = *puVar5;
          local_c8 = (ulong *)*plVar2;
        }
        local_c0 = plVar2[1];
        *plVar2 = (long)puVar5;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        get_import_path_abi_cxx11_(&local_e8,this,program);
        uVar8 = 0xf;
        if (local_c8 != &local_b8) {
          uVar8 = local_b8;
        }
        if (uVar8 < local_e8._M_string_length + local_c0) {
          uVar9 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            uVar9 = local_e8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar9 < local_e8._M_string_length + local_c0) goto LAB_0028d563;
          puVar3 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_c8);
        }
        else {
LAB_0028d563:
          puVar3 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_c8,(ulong)local_e8._M_dataplus._M_p);
        }
        puVar1 = puVar3 + 2;
        if ((undefined8 *)*puVar3 == puVar1) {
          local_f8 = *puVar1;
          uStack_f0 = puVar3[3];
          local_108 = &local_f8;
        }
        else {
          local_f8 = *puVar1;
          local_108 = (undefined8 *)*puVar3;
        }
        local_100 = puVar3[1];
        *puVar3 = puVar1;
        puVar3[1] = 0;
        *(undefined1 *)puVar1 = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_108);
        local_a8 = (t_js_generator *)local_98;
        ptVar7 = (t_js_generator *)(plVar2 + 2);
        if ((t_js_generator *)*plVar2 == ptVar7) {
          local_98._0_8_ = (ptVar7->super_t_oop_generator).super_t_generator._vptr_t_generator;
          local_98._8_8_ = plVar2[3];
        }
        else {
          local_98._0_8_ = (ptVar7->super_t_oop_generator).super_t_generator._vptr_t_generator;
          local_a8 = (t_js_generator *)*plVar2;
        }
        local_a0 = plVar2[1];
        *plVar2 = (long)ptVar7;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        ptVar7 = local_a8;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a8);
        if (local_a8 != (t_js_generator *)local_98) {
          operator_delete(local_a8);
        }
        if (local_108 != &local_f8) {
          operator_delete(local_108);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p);
        }
        if (local_c8 != &local_b8) {
          operator_delete(local_c8);
        }
        if ((_Base_ptr *)local_98._16_8_ != &local_78) {
          operator_delete((void *)local_98._16_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        pptVar6 = pptVar6 + 1;
      } while (pptVar6 != (pointer)local_58._M_p);
    }
    if ((local_68->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (local_68->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string t_js_generator::render_includes() {
  string result = "";

  if (gen_node_) {
    const vector<t_program*>& includes = program_->get_includes();
    for (auto include : includes) {
      result += js_const_type_ + make_valid_nodeJs_identifier(include->get_name()) + "_ttypes = require('" + get_import_path(include) + "');\n";
    }
    if (includes.size() > 0) {
      result += "\n";
    }
  }

  return result;
}